

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O0

void printInfo(void)

{
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int j_1;
  int i_5;
  int j;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  printf("Round %d:  %d vs %d\n",(ulong)(uint)turnID,(ulong)(uint)gameBoard.elimTotal[0],
         (ulong)(uint)gameBoard.elimTotal[1]);
  printf("count:");
  for (local_4 = 0; local_4 < 7; local_4 = local_4 + 1) {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[0][local_4]);
  }
  printf("\ncount:");
  for (local_8 = 0; local_8 < 7; local_8 = local_8 + 1) {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[1][local_8]);
  }
  putchar(10);
  putchar(10);
  for (local_c = 1; local_c < 0x15; local_c = local_c + 1) {
    sprintf(printInfo::ans[local_c + -1],"%2d",(ulong)(0x15 - local_c));
  }
  for (local_10 = 0; local_10 < 0x14; local_10 = local_10 + 1) {
    printInfo::ans[local_10][0x18] = '|';
    printInfo::ans[local_10][0xd] = '|';
    printInfo::ans[local_10][2] = '|';
  }
  for (local_14 = 1; local_14 < 0x15; local_14 = local_14 + 1) {
    for (local_18 = 1; local_18 < 0xb; local_18 = local_18 + 1) {
      printInfo::ans[0x14 - local_14][local_18 + 2] =
           " *+"[*(int *)((long)local_14 * 0x30 + 0x149384 + (long)local_18 * 4)];
    }
  }
  for (local_1c = 1; local_1c < 0x15; local_1c = local_1c + 1) {
    for (local_20 = 1; local_20 < 0xb; local_20 = local_20 + 1) {
      printInfo::ans[0x14 - local_1c][local_20 + 0xd] =
           " *+"[*(int *)((long)local_1c * 0x30 + 0x1497a4 + (long)local_20 * 4)];
    }
  }
  for (local_24 = 0; local_24 < 0x14; local_24 = local_24 + 1) {
    puts(printInfo::ans[local_24]);
  }
  printf("  ");
  for (local_28 = 0; local_28 < 0x17; local_28 = local_28 + 1) {
    putchar(0x2d);
  }
  printf("\n   ");
  for (local_2c = 1; local_2c < 0xb; local_2c = local_2c + 1) {
    printf("%d",(long)local_2c % 10 & 0xffffffff);
  }
  putchar(0x7c);
  for (local_30 = 1; local_30 < 0xb; local_30 = local_30 + 1) {
    printf("%d",(long)local_30 % 10 & 0xffffffff);
  }
  putchar(10);
  getchar();
  return;
}

Assistant:

void printInfo()
{
    printf("Round %d:  %d vs %d\n", turnID, gameBoard.elimTotal[0], gameBoard.elimTotal[1]);
    printf("count:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[0][i]);
    printf("\ncount:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[1][i]);
    putchar('\n');
    putchar('\n');
    static char ans[20][26] = {};
    for (int i = 1; i <= 20; ++i)
        sprintf(ans[i - 1], "%2d", 21 - i);
    for (int i = 0; i < 20; ++i)
        ans[i][2] = ans[i][13] = ans[i][24] = '|';
    static const char mp[3] = {' ', '*', '+'};
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][2 + j] = mp[gameBoard.gridInfo[0][i][j]];
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][13 + j] = mp[gameBoard.gridInfo[1][i][j]];
    for (int i = 0; i < 20; ++i)
        puts(ans[i]);
    printf("  ");
    for (int i = 0; i < 23; ++i)
        putchar('-');
    printf("\n   ");
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('|');
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('\n');
    getchar();
}